

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.h
# Opt level: O3

void __thiscall snmalloc::LocalEntropy::make_free_list_key(LocalEntropy *this,FreeListKey *key)

{
  uint64_t uVar1;
  uint64_t uVar2;
  bool bVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar1 = this->local_key;
  uVar2 = this->local_counter;
  uVar4 = uVar2 + 1;
  bVar3 = true;
  do {
    bVar5 = bVar3;
    uVar4 = ((uVar4 & 0xfffffffff) * uVar1 ^ uVar4) >> 0x20 | uVar4 << 0x20;
    bVar3 = false;
  } while (bVar5);
  key->key1 = uVar4;
  uVar4 = uVar2 + 2;
  bVar3 = true;
  do {
    bVar5 = bVar3;
    uVar4 = ((uVar4 & 0xfffffffff) * uVar1 ^ uVar4) >> 0x20 | uVar4 << 0x20;
    bVar3 = false;
  } while (bVar5);
  key->key2 = uVar4;
  uVar4 = uVar2 + 3;
  this->local_counter = uVar4;
  bVar3 = true;
  do {
    bVar5 = bVar3;
    uVar4 = ((uVar4 & 0xfffffffff) * uVar1 ^ uVar4) >> 0x20 | uVar4 << 0x20;
    bVar3 = false;
  } while (bVar5);
  key->key_next = uVar4;
  return;
}

Assistant:

void make_free_list_key(FreeListKey& key)
    {
      if constexpr (bits::BITS == 64)
      {
        key.key1 = static_cast<address_t>(get_next());
        key.key2 = static_cast<address_t>(get_next());
        key.key_next = static_cast<address_t>(get_next());
      }
      else
      {
        key.key1 = static_cast<address_t>(get_next() & 0xffff'ffff);
        key.key2 = static_cast<address_t>(get_next() & 0xffff'ffff);
        key.key_next = static_cast<address_t>(get_next() & 0xffff'ffff);
      }
    }